

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O3

block_t * __thiscall
plot::detail::braille::block_t::over(block_t *__return_storage_ptr__,block_t *this,block_t *other)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  block_t *pbVar14;
  char cVar15;
  float fVar16;
  byte bVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  uint uVar29;
  uint uVar30;
  float fVar31;
  
  bVar10 = other->pixels;
  bVar11 = this->pixels;
  bVar12 = bVar11 & bVar10;
  auVar17 = ~ZEXT216(CONCAT11(bVar11,bVar10)) & ZEXT216(CONCAT11(bVar10,bVar11));
  uVar20 = auVar17._0_2_;
  uVar21 = uVar20 >> 1 & 0x101;
  uVar22 = uVar20 >> 2 & 0x101;
  uVar29 = uVar20 >> 3 & 0x101;
  uVar23 = uVar20 >> 4 & 0x101;
  uVar30 = uVar20 >> 5 & 0x101;
  uVar24 = uVar20 >> 6 & 0x101;
  auVar18._0_2_ = uVar20 >> 7;
  auVar18._2_6_ = 0;
  auVar18._8_2_ = auVar17._8_2_ >> 7;
  auVar18._10_2_ = auVar17._10_2_ >> 7;
  auVar18._12_2_ = auVar17._12_2_ >> 7;
  auVar18._14_2_ = auVar17._14_2_ >> 7;
  cVar15 = SUB161(auVar18 & _DAT_0010c0a0,0) + (char)uVar21 + SUB161(_DAT_0010c090 & auVar17,0) +
           (char)uVar24 + (char)uVar30 + (char)uVar23 + (char)uVar29 + (char)uVar22;
  bVar19 = SUB161(auVar18 & _DAT_0010c0a0,1) +
           (char)(uVar21 >> 8) + SUB161(_DAT_0010c090 & auVar17,1) +
           (char)(uVar24 >> 8) +
           (char)(uVar30 >> 8) + (char)(uVar23 >> 8) + (char)(uVar29 >> 8) + (char)(uVar22 >> 8);
  iVar13 = (int)(char)(((bVar12 & 1) - ((char)bVar12 >> 7)) + (bVar12 >> 1 & 1) +
                       ((bVar12 >> 2 & 1) != 0) + (bVar12 >> 3 & 1) + ((bVar12 >> 4 & 1) != 0) +
                       (bVar12 >> 5 & 1) + ((bVar12 >> 6 & 1) != 0));
  fVar26 = (float)(int)((CONCAT11(bVar19,cVar15) & 0xff) + iVar13 + (uint)bVar19);
  pfVar1 = &(other->color).a;
  pbVar14 = this;
  if (*pfVar1 != 0.0) {
    pbVar14 = other;
  }
  if (NAN(*pfVar1)) {
    pbVar14 = other;
  }
  pfVar1 = &(this->color).a;
  if (*pfVar1 != 0.0) {
    other = this;
  }
  if (NAN(*pfVar1)) {
    other = this;
  }
  fVar25 = (float)(int)(char)bVar19 / fVar26;
  fVar16 = (float)(int)cVar15 / fVar26;
  fVar26 = (float)iVar13 / fVar26;
  uVar2 = (pbVar14->color).r;
  uVar6 = (pbVar14->color).g;
  uVar3 = (pbVar14->color).b;
  uVar7 = (pbVar14->color).a;
  uVar4 = (other->color).r;
  uVar8 = (other->color).g;
  uVar5 = (other->color).b;
  uVar9 = (other->color).a;
  fVar27 = 1.0 - (float)uVar9;
  fVar31 = (float)uVar7 * fVar27 + (float)uVar9;
  auVar28._0_4_ = fVar27 * (float)uVar7 * (float)uVar2 + (float)uVar9 * (float)uVar4;
  auVar28._4_4_ = fVar27 * (float)uVar7 * (float)uVar6 + (float)uVar9 * (float)uVar8;
  auVar28._8_4_ = fVar27 * (float)uVar7 * 0.0 + (float)uVar9 * 0.0;
  auVar28._12_4_ = fVar27 * (float)uVar7 * 0.0 + (float)uVar9 * 0.0;
  auVar17._4_4_ = fVar31;
  auVar17._0_4_ = fVar31;
  auVar17._8_4_ = uVar7;
  auVar17._12_4_ = uVar7;
  auVar17 = divps(auVar28,auVar17);
  (__return_storage_ptr__->color).r =
       auVar17._0_4_ * fVar26 + fVar16 * (float)uVar4 + fVar25 * (float)uVar2;
  (__return_storage_ptr__->color).g =
       auVar17._4_4_ * fVar26 + fVar16 * (float)uVar8 + fVar25 * (float)uVar6;
  (__return_storage_ptr__->color).b =
       (((float)uVar3 * (float)uVar7 * fVar27 + (float)uVar5 * (float)uVar9) / fVar31) * fVar26 +
       (float)uVar5 * fVar16 + (float)uVar3 * fVar25;
  (__return_storage_ptr__->color).a =
       fVar31 * fVar26 + (float)uVar9 * fVar16 + (float)uVar7 * fVar25;
  __return_storage_ptr__->pixels = bVar11 | bVar10;
  return __return_storage_ptr__;
}

Assistant:

block_t over(block_t const& other) const {
            auto old = bitcount(other.pixels & ~pixels);
            auto new_ = bitcount(pixels & ~other.pixels);

            std::uint8_t over_pixels = other.pixels & pixels;
            auto over_ = bitcount(over_pixels);

            float total = old + new_ + over_;

            auto old_color = (other.color.a != 0.0f) ? other.color : color;
            auto new_color = (color.a != 0.0f) ? color : other.color;
            auto over_color = new_color.over(old_color);

            auto mixed_color = (old/total)*old_color + (new_/total)*new_color + (over_/total)*over_color;

            return { mixed_color, std::uint8_t(pixels | other.pixels) };
        }